

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_getItemByIdSpecificType_Test::~Annotator_getItemByIdSpecificType_Test
          (Annotator_getItemByIdSpecificType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, getItemByIdSpecificType)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();
    auto c2v1 = model->component("component2")->variable("variable1");
    auto c2c3v1 = model->component("component2")->component("component3")->variable("variable1");
    auto c2v2 = model->component("component2")->variable("variable2");
    auto c2c3v2 = model->component("component2")->component("component3")->variable("variable2");

    annotator->setModel(model);

    EXPECT_EQ(model, annotator->model("model_1"));
    EXPECT_EQ(model, annotator->encapsulation("encapsulation_1"));
    EXPECT_EQ(model->component("component1"), annotator->component("component_1"));
    EXPECT_EQ(model->component("component2"), annotator->component("component_2"));
    EXPECT_EQ(model->component("component2"), annotator->componentEncapsulation("component_ref_1"));
    EXPECT_EQ(model->component("component2")->component("component3"), annotator->component("component_3"));
    EXPECT_EQ(model->component("component2")->component("component3"), annotator->componentEncapsulation("component_ref_2"));
    EXPECT_EQ(model->component("component1")->importSource(), annotator->importSource("import_1"));
    EXPECT_EQ(model->units("units1"), annotator->units("units_1"));
    EXPECT_EQ(model->units("units1")->importSource(), annotator->importSource("import_2"));
    EXPECT_EQ(model->units("units2"), annotator->units("units_2"));
    EXPECT_EQ(model->units("units2"), annotator->unitsItem("unit_1")->units());
    EXPECT_EQ(size_t(0), annotator->unitsItem("unit_1")->index());
    EXPECT_EQ(model->component("component2")->variable("variable1"), annotator->variable("variable_1"));
    EXPECT_EQ(model->component("component2")->variable("variable2"), annotator->variable("variable_2"));
    EXPECT_EQ(model->component("component2")->reset(0), annotator->reset("reset_1"));
    EXPECT_EQ(model->component("component2")->reset(0), annotator->testValue("test_value_1"));
    EXPECT_EQ(model->component("component2")->reset(0), annotator->resetValue("reset_value_1"));
    EXPECT_EQ(model->component("component2")->component("component3")->variable("variable1"), annotator->variable("variable_3"));
    EXPECT_EQ(model->component("component2")->component("component3")->variable("variable2"), annotator->variable("variable_4"));
    EXPECT_EQ(c2v1, annotator->connection("connection_1")->variable1());
    EXPECT_EQ(c2c3v1, annotator->connection("connection_1")->variable2());
    EXPECT_EQ(c2v1, annotator->mapVariables("map_variables_1")->variable1());
    EXPECT_EQ(c2c3v1, annotator->mapVariables("map_variables_1")->variable2());
    EXPECT_EQ(c2v2, annotator->mapVariables("map_variables_2")->variable1());
    EXPECT_EQ(c2c3v2, annotator->mapVariables("map_variables_2")->variable2());

    EXPECT_EQ(nullptr, annotator->model("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->encapsulation("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->component("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->variable("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->units("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->unitsItem("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->reset("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->resetValue("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->testValue("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->componentEncapsulation("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->connection("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->mapVariables("i_dont_exist"));
    EXPECT_EQ(nullptr, annotator->importSource("i_dont_exist"));
}